

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obstacle.cpp
# Opt level: O0

int __thiscall Obstacle::newPos(Obstacle *this,int pos)

{
  int local_14;
  int pos_local;
  Obstacle *this_local;
  
  if (this->_limit < pos + this->_speed) {
    local_14 = 0;
  }
  else if (pos + this->_speed < 0) {
    local_14 = this->_limit;
  }
  else {
    local_14 = this->_speed + pos;
  }
  return local_14;
}

Assistant:

int Obstacle::newPos(int pos){
        if (pos + _speed > _limit){

            pos = 0;// to make its edge visible

        }else if(pos + _speed < 0){
            
            pos = _limit;

        }else{

            pos += _speed;
        }
        return pos;

    }